

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcItem * isSelfJoinView(SrcList *pTabList,SrcItem *pThis,int iFirst,int iEnd)

{
  long lVar1;
  Select *pSVar2;
  int in_ECX;
  int in_EDX;
  int iVar3;
  long in_RSI;
  long in_RDI;
  Select *pS1;
  Select *pSel;
  SrcItem *pItem;
  int local_1c;
  SrcItem *local_8;
  
  lVar1 = **(long **)(in_RSI + 0x40);
  local_1c = in_EDX;
  if ((*(uint *)(lVar1 + 4) & 0x1000000) == 0) {
    do {
      if (in_ECX <= local_1c) {
        return (SrcItem *)0x0;
      }
      iVar3 = local_1c + 1;
      local_8 = (SrcItem *)(in_RDI + 8 + (long)local_1c * 0x48);
      local_1c = iVar3;
    } while (((((*(ushort *)&(local_8->fg).field_0x1 >> 2 & 1) == 0) ||
              ((*(ushort *)&(local_8->fg).field_0x1 >> 6 & 1) != 0)) ||
             (local_8->zName == (char *)0x0)) ||
            ((((local_8->pSTab->pSchema != *(Schema **)(*(long *)(in_RSI + 0x10) + 0x60) ||
               (iVar3 = sqlite3_stricmp(&DAT_aaaaaaaaaaaaaaaa,(char *)0x1ea1c4), iVar3 != 0)) ||
              ((pSVar2 = ((local_8->u4).pSubq)->pSelect, local_8->pSTab->pSchema == (Schema *)0x0 &&
               (*(u32 *)(lVar1 + 0x10) != pSVar2->selId)))) || ((pSVar2->selFlags & 0x1000000) != 0)
             )));
  }
  else {
    local_8 = (SrcItem *)0x0;
  }
  return local_8;
}

Assistant:

static SrcItem *isSelfJoinView(
  SrcList *pTabList,           /* Search for self-joins in this FROM clause */
  SrcItem *pThis,              /* Search for prior reference to this subquery */
  int iFirst, int iEnd        /* Range of FROM-clause entries to search. */
){
  SrcItem *pItem;
  Select *pSel;
  assert( pThis->fg.isSubquery );
  pSel = pThis->u4.pSubq->pSelect;
  assert( pSel!=0 );
  if( pSel->selFlags & SF_PushDown ) return 0;
  while( iFirst<iEnd ){
    Select *pS1;
    pItem = &pTabList->a[iFirst++];
    if( !pItem->fg.isSubquery ) continue;
    if( pItem->fg.viaCoroutine ) continue;
    if( pItem->zName==0 ) continue;
    assert( pItem->pSTab!=0 );
    assert( pThis->pSTab!=0 );
    if( pItem->pSTab->pSchema!=pThis->pSTab->pSchema ) continue;
    if( sqlite3_stricmp(pItem->zName, pThis->zName)!=0 ) continue;
    pS1 = pItem->u4.pSubq->pSelect;
    if( pItem->pSTab->pSchema==0 && pSel->selId!=pS1->selId ){
      /* The query flattener left two different CTE tables with identical
      ** names in the same FROM clause. */
      continue;
    }
    if( pS1->selFlags & SF_PushDown ){
      /* The view was modified by some other optimization such as
      ** pushDownWhereTerms() */
      continue;
    }
    return pItem;
  }
  return 0;
}